

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

bool arangodb::velocypack::Collection::all(Slice slice,Predicate *predicate)

{
  char cVar1;
  long lVar2;
  Slice s;
  ArrayIterator it;
  uint8_t *local_60;
  long local_58;
  ArrayIterator local_50;
  
  ArrayIterator::ArrayIterator(&local_50,slice);
  if (local_50._position != local_50._size) {
    lVar2 = 0;
    do {
      local_60 = (uint8_t *)ArrayIterator::value(&local_50);
      local_58 = lVar2;
      if (*(long *)(predicate + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      cVar1 = (**(code **)(predicate + 0x18))(predicate,&local_60,&local_58);
      if (cVar1 == '\0') {
        return false;
      }
      ArrayIterator::next(&local_50);
      lVar2 = lVar2 + 1;
    } while (local_50._position != local_50._size);
  }
  return true;
}

Assistant:

bool Collection::all(Slice slice, Predicate const& predicate) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    Slice s = it.value();
    if (!predicate(s, index)) {
      return false;
    }
    it.next();
    ++index;
  }

  return true;
}